

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O0

int encodeLatLonToMapcodes_internal
              (Mapcodes *mapcodes,double lat,double lon,Territory territoryContext,
              int stop_with_one_result,int requiredEncoder,int extraDigits)

{
  int iVar1;
  MapcodeError MVar2;
  Territory local_6c;
  int local_64;
  Territory ccode;
  int j;
  int r;
  int i;
  int coord;
  int sum;
  EncodeRec enc;
  int extraDigits_local;
  int requiredEncoder_local;
  int stop_with_one_result_local;
  Territory territoryContext_local;
  double lon_local;
  double lat_local;
  Mapcodes *mapcodes_local;
  
  mapcodes->count = 0;
  enc._8_8_ = mapcodes;
  enc.mapcodes._0_4_ = extraDigits;
  enc.mapcodes._4_4_ = requiredEncoder;
  MVar2 = convertCoordsToMicrosAndFractions
                    ((Point32 *)&coord,(int *)&enc,&enc.coord32.lonMicroDeg,lat,lon);
  if (MVar2 < ERR_OK) {
    mapcodes_local._4_4_ = 0;
  }
  else {
    if (territoryContext < _TERRITORY_MIN) {
      r = sum;
      j = 0;
      while( true ) {
        iVar1 = REDIVAR[j];
        if ((-1 < iVar1) && (iVar1 < 0x400)) break;
        r = (sum + coord) - r;
        if (iVar1 < r) {
          j = REDIVAR[j + 1];
        }
        else {
          j = j + 2;
        }
      }
      for (local_64 = 0; local_64 <= iVar1; local_64 = local_64 + 1) {
        if (local_64 == iVar1) {
          local_6c = TERRITORY_AAA;
        }
        else {
          local_6c = REDIVAR[j + 1 + local_64];
        }
        encoderEngine(local_6c,(EncodeRec *)&coord,stop_with_one_result,(int)enc.mapcodes,
                      enc.mapcodes._4_4_,TERRITORY_NONE);
        if (((stop_with_one_result != 0) || (-1 < enc.mapcodes._4_4_)) && (0 < *(int *)enc._8_8_))
        break;
      }
    }
    else {
      encoderEngine(territoryContext,(EncodeRec *)&coord,stop_with_one_result,(int)enc.mapcodes,
                    enc.mapcodes._4_4_,TERRITORY_NONE);
    }
    mapcodes_local._4_4_ = mapcodes->count;
  }
  return mapcodes_local._4_4_;
}

Assistant:

static int encodeLatLonToMapcodes_internal(Mapcodes *mapcodes,
                                           const double lat, const double lon,
                                           const enum Territory territoryContext, const int stop_with_one_result,
                                           const int requiredEncoder, const int extraDigits) {
    EncodeRec enc;
    enc.mapcodes = mapcodes;
    enc.mapcodes->count = 0;
    ASSERT(mapcodes);
    ASSERT((0 <= extraDigits) && (extraDigits <= MAX_PRECISION_DIGITS));

    if (convertCoordsToMicrosAndFractions(&enc.coord32, &enc.fraclat, &enc.fraclon, lat, lon) < 0) {
        return 0;
    }

    if (territoryContext < _TERRITORY_MIN) // ALL results?
    {

#ifndef NO_FAST_ENCODE
        {
            const int sum = enc.coord32.lonMicroDeg + enc.coord32.latMicroDeg;
            int coord = enc.coord32.lonMicroDeg;
            int i = 0; // pointer into REDIVAR
            for (;;) {
                const int r = REDIVAR[i++];
                if (r >= 0 && r < 1024) { // leaf?
                    int j;
                    for (j = 0; j <= r; j++) {
                        const enum Territory ccode = (j == r ? TERRITORY_AAA : (enum Territory) REDIVAR[i + j]);
                        encoderEngine(ccode, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                        if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                            break;
                        }
                    }
                    break;
                } else {
                    coord = sum - coord;
                    if (coord > r) {
                        i = REDIVAR[i];
                    } else {
                        i++;
                    }
                }
            }
        }
#else
        {
            int i;
            for (i = _TERRITORY_MIN + 1; i < _TERRITORY_MAX; i++) {
                encoderEngine((enum Territory) i, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
                if ((stop_with_one_result || (requiredEncoder >= 0)) && (enc.mapcodes->count > 0)) {
                    break;
                }
            }
        }
#endif

    } else {
        encoderEngine(territoryContext, &enc, stop_with_one_result, extraDigits, requiredEncoder, TERRITORY_NONE);
    }
    return mapcodes->count;
}